

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Ay_Emu::run_clocks(Ay_Emu *this,blip_time_t *duration,int param_2)

{
  byte bVar1;
  int iVar2;
  cpu_time_t end_time;
  int iVar3;
  long lVar4;
  state_t *psVar5;
  ushort uVar6;
  
  psVar5 = (this->super_Ay_Cpu).state;
  iVar3 = -psVar5->base;
  psVar5->time = iVar3;
  if (this->cpc_mode == false && this->spectrum_mode == false) {
    *duration = *duration / 2;
    iVar3 = psVar5->time;
  }
  while( true ) {
    iVar3 = iVar3 + psVar5->base;
    iVar2 = *duration;
    if (iVar2 <= iVar3) break;
    end_time = this->next_play;
    if (iVar2 < this->next_play) {
      end_time = iVar2;
    }
    Ay_Cpu::run(&this->super_Ay_Cpu,end_time);
    psVar5 = (this->super_Ay_Cpu).state;
    iVar3 = psVar5->time;
    if ((this->next_play <= psVar5->base + iVar3) &&
       (this->next_play = this->next_play + this->play_period, (this->super_Ay_Cpu).r.iff1 != '\0'))
    {
      uVar6 = (this->super_Ay_Cpu).r.pc;
      bVar1 = (this->mem).ram[uVar6];
      (this->super_Ay_Cpu).r.iff1 = '\0';
      (this->super_Ay_Cpu).r.iff2 = '\0';
      iVar3 = (uint)(bVar1 == 'v') + (uint)uVar6;
      uVar6 = (this->super_Ay_Cpu).r.sp;
      (this->mem).ram[uVar6 - 1 & 0xffff] = (byte)((uint)iVar3 >> 8);
      uVar6 = uVar6 - 2;
      (this->super_Ay_Cpu).r.sp = uVar6;
      (this->mem).ram[uVar6] = (byte)iVar3;
      (this->super_Ay_Cpu).r.pc = 0x38;
      iVar2 = psVar5->time;
      iVar3 = iVar2 + 0xc;
      psVar5->time = iVar3;
      if ((this->super_Ay_Cpu).r.im == '\x02') {
        iVar3 = iVar2 + 0x12;
        psVar5->time = iVar3;
        lVar4 = (ulong)(this->super_Ay_Cpu).r.i * 0x100;
        (this->super_Ay_Cpu).r.pc =
             CONCAT11((this->mem).ram[(int)lVar4 + 0x100U & 0xffff],(this->mem).ram[lVar4 + 0xff]);
      }
    }
  }
  *duration = iVar3;
  this->next_play = this->next_play - iVar3;
  psVar5->time = psVar5->time - *duration;
  Ay_Apu::end_frame(&this->apu,*duration);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Ay_Emu::run_clocks( blip_time_t& duration, int )
{
	set_time( 0 );
	if ( !(spectrum_mode | cpc_mode) )
		duration /= 2; // until mode is set, leave room for halved clock rate
	
	while ( time() < duration )
	{
		cpu::run( min( duration, (blip_time_t) next_play ) );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			
			if ( r.iff1 )
			{
				if ( mem.ram [r.pc] == 0x76 )
					r.pc++;
				
				r.iff1 = r.iff2 = 0;
				
				mem.ram [--r.sp] = uint8_t (r.pc >> 8);
				mem.ram [--r.sp] = uint8_t (r.pc);
				r.pc = 0x38;
				cpu::adjust_time( 12 );
				if ( r.im == 2 )
				{
					cpu::adjust_time( 6 );
					unsigned addr = r.i * 0x100u + 0xFF;
					r.pc = mem.ram [(addr + 1) & 0xFFFF] * 0x100u + mem.ram [addr];
				}
			}
		}
	}
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	
	apu.end_frame( duration );
	
	return 0;
}